

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doh.c
# Opt level: O2

CURLcode Curl_doh_is_resolved(Curl_easy *data,Curl_dns_entry **dnsp)

{
  dynbuf *s;
  byte bVar1;
  DNStype DVar2;
  dohdata *pdVar3;
  sockaddr *psVar4;
  undefined8 uVar5;
  char *pcVar6;
  DOHcode DVar7;
  DNStype DVar8;
  CURLcode CVar9;
  uchar *puVar10;
  size_t sVar11;
  long lVar12;
  size_t sVar13;
  size_t sVar14;
  Curl_addrinfo *pCVar15;
  Curl_dns_entry *pCVar16;
  sa_family_t sVar17;
  int iVar18;
  char *pcVar19;
  ushort uVar20;
  uint uVar21;
  ushort uVar22;
  long lVar23;
  Curl_addrinfo *pCVar24;
  uint uVar25;
  dynbuf *s_00;
  ushort uVar26;
  ulong uVar27;
  anon_union_16_2_f9ece763_for_ip *paVar28;
  size_t sVar29;
  bool bVar30;
  dohentry *local_380;
  DOHcode rc [2];
  uint local_328 [2];
  char local_31e [126];
  dohentry de;
  
  pdVar3 = (data->req).doh;
  *dnsp = (Curl_dns_entry *)0x0;
  if (pdVar3 == (dohdata *)0x0) {
    CVar9 = CURLE_OUT_OF_MEMORY;
  }
  else if ((pdVar3->probe[0].easy == (CURL_conflict *)0x0) &&
          (pdVar3->probe[1].easy == (CURL_conflict *)0x0)) {
    Curl_failf(data,"Could not DoH-resolve: %s",(data->state).async.hostname);
    CVar9 = (((uint)data->conn->bits & 0x20) == 0) + CURLE_COULDNT_RESOLVE_PROXY;
  }
  else {
    CVar9 = CURLE_OK;
    if (pdVar3->pending == 0) {
      rc[0] = DOH_OK;
      rc[1] = DOH_OK;
      for (lVar23 = 8; lVar23 != 0x478; lVar23 = lVar23 + 0x238) {
        curl_multi_remove_handle
                  (data->multi,*(Curl_easy **)(pdVar3->probe[0].dohbuffer + lVar23 + -0x14));
        Curl_close((Curl_easy **)(pdVar3->probe[0].dohbuffer + lVar23 + -0x14));
      }
      local_380 = &de;
      memset(local_380,0,0x270);
      de.ttl = 0x7fffffff;
      for (lVar23 = 0; lVar23 != 0x80; lVar23 = lVar23 + 0x20) {
        Curl_dyn_init((dynbuf *)((long)&de.cname[0].bufr + lVar23),0x100);
      }
      lVar23 = 0;
LAB_0051a4b6:
      if (lVar23 != 2) {
        if (pdVar3->probe[lVar23].dnstype != 0) {
          s = &pdVar3->probe[lVar23].serverdoh;
          puVar10 = Curl_dyn_uptr(s);
          sVar11 = Curl_dyn_len(s);
          DVar2 = pdVar3->probe[lVar23].dnstype;
          local_328[0] = 0xc;
          DVar7 = DOH_TOO_SMALL_BUFFER;
          if ((((0xb < sVar11) && (DVar7 = DOH_DNS_BAD_ID, puVar10 != (uchar *)0x0)) &&
              (*puVar10 == '\0')) &&
             ((puVar10[1] == '\0' && (DVar7 = DOH_DNS_BAD_RCODE, (puVar10[3] & 0xf) == 0)))) {
            uVar22 = *(ushort *)(puVar10 + 4) << 8 | *(ushort *)(puVar10 + 4) >> 8;
            sVar29 = 0xc;
            uVar21 = local_328[0];
            do {
              local_328[0] = uVar21;
              bVar30 = uVar22 == 0;
              uVar22 = uVar22 - 1;
              if (bVar30) {
                uVar22 = *(ushort *)(puVar10 + 6) << 8 | *(ushort *)(puVar10 + 6) >> 8;
                uVar26 = 0;
                uVar21 = local_328[0];
                goto LAB_0051a5a7;
              }
              DVar7 = skipqname(puVar10,sVar11,local_328);
              if (DVar7 != DOH_OK) goto LAB_0051a961;
              sVar29 = (size_t)(local_328[0] + 4);
              uVar21 = local_328[0] + 4;
            } while (sVar29 <= sVar11);
            goto LAB_0051a954;
          }
          goto LAB_0051a961;
        }
        goto LAB_0051a9cd;
      }
      if ((rc[0] == DOH_OK) || (rc[1] == DOH_OK)) {
        if ((data != (Curl_easy *)0x0) &&
           ((((data->set).field_0x8bd & 0x10) != 0 &&
            (Curl_infof(data,"DoH Host name: %s",pdVar3->host),
            ((data->set).field_0x8bd & 0x10) != 0)))) {
          Curl_infof(data,"TTL: %u seconds",(ulong)de.ttl);
        }
        puVar10 = de.addr[0].ip.v4 + 1;
        for (lVar23 = 0; lVar23 < de.numaddr; lVar23 = lVar23 + 1) {
          iVar18 = de.addr[lVar23].type;
          if (iVar18 == 0x1c) {
            curl_msnprintf((char *)local_328,0x80,"DoH AAAA: ");
            pcVar19 = local_31e;
            sVar11 = 0x76;
            for (uVar27 = 0; uVar27 < 0x10; uVar27 = uVar27 + 2) {
              pcVar6 = "    :";
              if (uVar27 == 0) {
                pcVar6 = "PK\x01\x02";
              }
              curl_msnprintf(pcVar19,sVar11,"%s%02x%02x",pcVar6 + 4,(ulong)puVar10[uVar27 - 1],
                             (ulong)puVar10[uVar27]);
              sVar14 = strlen(pcVar19);
              sVar11 = sVar11 - sVar14;
              pcVar19 = pcVar19 + sVar14;
            }
            if ((data != (Curl_easy *)0x0) && (((data->set).field_0x8bd & 0x10) != 0)) {
              Curl_infof(data,"%s",local_328);
            }
          }
          else if (((iVar18 == 1) && (data != (Curl_easy *)0x0)) &&
                  (((data->set).field_0x8bd & 0x10) != 0)) {
            Curl_infof(data,"DoH A: %u.%u.%u.%u",(ulong)de.addr[lVar23].ip.v4[0],
                       (ulong)de.addr[lVar23].ip.v4[1],(ulong)de.addr[lVar23].ip.v4[2],
                       (ulong)de.addr[lVar23].ip.v4[3]);
          }
          puVar10 = puVar10 + 0x14;
        }
        for (lVar23 = 0; lVar23 < de.numcname; lVar23 = lVar23 + 1) {
          if ((data != (Curl_easy *)0x0) && (((data->set).field_0x8bd & 0x10) != 0)) {
            pcVar19 = Curl_dyn_ptr(local_380->cname);
            Curl_infof(data,"CNAME: %s",pcVar19);
          }
          local_380 = (dohentry *)(local_380->cname + 1);
        }
        pcVar19 = pdVar3->host;
        sVar14 = strlen(pcVar19);
        if (de.numaddr == 0) {
          CVar9 = CURLE_COULDNT_RESOLVE_HOST;
LAB_0051adf1:
          de_cleanup(&de);
          return CVar9;
        }
        uVar22 = (ushort)pdVar3->port;
        paVar28 = &de.addr[0].ip;
        local_380 = (dohentry *)0x0;
        pCVar24 = (Curl_addrinfo *)0x0;
        for (lVar23 = 0; lVar23 < de.numaddr; lVar23 = lVar23 + 1) {
          iVar18 = ((dohaddr *)((long)paVar28 + -4))->type;
          lVar12 = 0x1c;
          if (iVar18 != 0x1c) {
            lVar12 = 0x10;
          }
          pCVar15 = (Curl_addrinfo *)(*Curl_ccalloc)(1,sVar14 + 0x31 + lVar12);
          if (pCVar15 == (Curl_addrinfo *)0x0) {
            Curl_freeaddrinfo((Curl_addrinfo *)local_380);
            CVar9 = CURLE_OUT_OF_MEMORY;
            goto LAB_0051adf1;
          }
          pCVar15->ai_addr = (sockaddr *)(pCVar15 + 1);
          pcVar6 = (char *)((long)&pCVar15[1].ai_flags + lVar12);
          pCVar15->ai_canonname = pcVar6;
          memcpy(pcVar6,pcVar19,sVar14 + 1);
          if (local_380 == (dohentry *)0x0) {
            local_380 = (dohentry *)pCVar15;
          }
          if (pCVar24 != (Curl_addrinfo *)0x0) {
            pCVar24->ai_next = pCVar15;
          }
          pCVar15->ai_family = (uint)(iVar18 == 0x1c) * 8 + 2;
          pCVar15->ai_socktype = 1;
          pCVar15->ai_addrlen = (curl_socklen_t)lVar12;
          psVar4 = pCVar15->ai_addr;
          if (iVar18 == 0x1c) {
            uVar5 = *(undefined8 *)((long)paVar28 + 8);
            *(undefined8 *)(psVar4->sa_data + 6) = *(undefined8 *)paVar28;
            psVar4[1].sa_family = (short)uVar5;
            psVar4[1].sa_data[0] = (char)((ulong)uVar5 >> 0x10);
            psVar4[1].sa_data[1] = (char)((ulong)uVar5 >> 0x18);
            psVar4[1].sa_data[2] = (char)((ulong)uVar5 >> 0x20);
            psVar4[1].sa_data[3] = (char)((ulong)uVar5 >> 0x28);
            psVar4[1].sa_data[4] = (char)((ulong)uVar5 >> 0x30);
            psVar4[1].sa_data[5] = (char)((ulong)uVar5 >> 0x38);
            sVar17 = 10;
          }
          else {
            *(undefined4 *)(psVar4->sa_data + 2) = *(undefined4 *)paVar28;
            sVar17 = 2;
          }
          psVar4->sa_family = sVar17;
          *(ushort *)psVar4->sa_data = uVar22 << 8 | uVar22 >> 8;
          paVar28 = (anon_union_16_2_f9ece763_for_ip *)((long)paVar28 + 0x14);
          pCVar24 = pCVar15;
        }
        if (data->share != (Curl_share *)0x0) {
          Curl_share_lock(data,CURL_LOCK_DATA_DNS,CURL_LOCK_ACCESS_SINGLE);
        }
        pCVar16 = Curl_cache_addr(data,(Curl_addrinfo *)local_380,pdVar3->host,0,pdVar3->port);
        if (data->share != (Curl_share *)0x0) {
          Curl_share_unlock(data,CURL_LOCK_DATA_DNS);
        }
        if (pCVar16 == (Curl_dns_entry *)0x0) {
          Curl_freeaddrinfo((Curl_addrinfo *)local_380);
        }
        else {
          (data->state).async.dns = pCVar16;
          *dnsp = pCVar16;
        }
        CVar9 = CURLE_OK;
      }
      else {
        CVar9 = CURLE_COULDNT_RESOLVE_HOST;
      }
      de_cleanup(&de);
      (*Curl_cfree)((data->req).doh);
      (data->req).doh = (dohdata *)0x0;
    }
  }
  return CVar9;
LAB_0051a5a7:
  do {
    local_328[0] = uVar21;
    bVar30 = uVar22 == 0;
    uVar22 = uVar22 - 1;
    if (bVar30) {
      uVar22 = *(ushort *)(puVar10 + 8) << 8 | *(ushort *)(puVar10 + 8) >> 8;
      uVar21 = local_328[0];
      goto LAB_0051a860;
    }
    DVar7 = skipqname(puVar10,sVar11,local_328);
    if (DVar7 != DOH_OK) goto LAB_0051a961;
    if (sVar11 < local_328[0] + 2) {
LAB_0051a849:
      DVar7 = DOH_DNS_OUT_OF_RANGE;
      goto LAB_0051a961;
    }
    uVar26 = *(ushort *)(puVar10 + (int)local_328[0]) << 8 |
             *(ushort *)(puVar10 + (int)local_328[0]) >> 8;
    DVar8 = (DNStype)uVar26;
    if (((uVar26 != 5) && (DVar8 != DNS_TYPE_DNAME)) && (DVar2 != DVar8)) {
      DVar7 = DOH_DNS_UNEXPECTED_TYPE;
      goto LAB_0051a961;
    }
    if (sVar11 < local_328[0] + 4) goto LAB_0051a849;
    if ((ushort)(*(ushort *)(puVar10 + (int)(local_328[0] + 2)) << 8 |
                *(ushort *)(puVar10 + (int)(local_328[0] + 2)) >> 8) != 1) {
      DVar7 = DOH_DNS_UNEXPECTED_CLASS;
      goto LAB_0051a961;
    }
    if (sVar11 < local_328[0] + 8) goto LAB_0051a849;
    uVar21 = *(uint *)(puVar10 + (int)(local_328[0] + 4));
    uVar21 = uVar21 >> 0x18 | (uVar21 & 0xff0000) >> 8 | (uVar21 & 0xff00) << 8 | uVar21 << 0x18;
    if (uVar21 < de.ttl) {
      de.ttl = uVar21;
    }
    uVar25 = local_328[0] + 10;
    uVar27 = (ulong)uVar25;
    if (sVar11 < uVar27) goto LAB_0051a849;
    uVar20 = *(ushort *)(puVar10 + (int)(local_328[0] + 8)) << 8 |
             *(ushort *)(puVar10 + (int)(local_328[0] + 8)) >> 8;
    uVar21 = uVar20 + uVar25;
    sVar29 = (size_t)uVar21;
    if (sVar11 < sVar29) goto LAB_0051a849;
    if (uVar26 == 0x1c) {
      if (uVar20 != 0x10) {
LAB_0051a8e2:
        DVar7 = DOH_DNS_RDATA_LEN;
        goto LAB_0051a961;
      }
      lVar12 = (long)de.numaddr;
      if (lVar12 < 0x18) {
        de.addr[lVar12].type = 0x1c;
        uVar5 = *(undefined8 *)(puVar10 + (int)uVar25 + 8);
        *(undefined8 *)&de.addr[lVar12].ip = *(undefined8 *)(puVar10 + (int)uVar25);
        *(undefined8 *)((long)&de.addr[lVar12].ip + 8) = uVar5;
LAB_0051a831:
        de.numaddr = de.numaddr + 1;
      }
      goto LAB_0051a5a7;
    }
    if (DVar8 != DNS_TYPE_CNAME) {
      if (DVar8 == DNS_TYPE_A) {
        if (uVar20 != 4) goto LAB_0051a8e2;
        lVar12 = (long)de.numaddr;
        if (lVar12 < 0x18) {
          de.addr[lVar12].type = 1;
          *(undefined4 *)&de.addr[lVar12].ip = *(undefined4 *)(puVar10 + (int)uVar25);
          goto LAB_0051a831;
        }
      }
      goto LAB_0051a5a7;
    }
    lVar12 = (long)de.numcname;
    if (lVar12 == 4) goto LAB_0051a5a7;
    de.numcname = de.numcname + 1;
    s_00 = de.cname + lVar12;
    iVar18 = -0x7f;
    do {
      if (sVar11 <= uVar27) goto LAB_0051a954;
      bVar1 = puVar10[uVar27];
      if ((bVar1 & 0xc0) == 0) {
        uVar25 = (int)uVar27 + 1;
        if ((ulong)bVar1 != 0) {
          sVar13 = Curl_dyn_len(s_00);
          if ((sVar13 == 0) || (CVar9 = Curl_dyn_addn(s_00,".",1), CVar9 == CURLE_OK)) {
            uVar27 = (ulong)(bVar1 + uVar25);
            if (sVar11 < uVar27) goto LAB_0051a8da;
            CVar9 = Curl_dyn_addn(s_00,puVar10 + uVar25,(ulong)bVar1);
            if (CVar9 == CURLE_OK) goto LAB_0051a7de;
          }
          DVar7 = DOH_OUT_OF_MEM;
          goto LAB_0051a961;
        }
        uVar27 = (ulong)uVar25;
      }
      else {
        if ((bVar1 & 0xc0) != 0xc0) {
LAB_0051a8da:
          DVar7 = DOH_DNS_BAD_LABEL;
          goto LAB_0051a961;
        }
        uVar27 = (ulong)((int)uVar27 + 1);
        if (sVar11 <= uVar27) goto LAB_0051a954;
        uVar27 = (ulong)((uint)puVar10[uVar27] | (bVar1 & 0x3f) << 8);
      }
LAB_0051a7de:
    } while ((bVar1 != 0) && (bVar30 = iVar18 != 0, iVar18 = iVar18 + 1, bVar30));
  } while (bVar1 == 0);
  DVar7 = DOH_DNS_LABEL_LOOP;
  goto LAB_0051a961;
  while( true ) {
    uVar21 = (uint)(ushort)(*(ushort *)(puVar10 + (int)(local_328[0] + 8)) << 8 |
                           *(ushort *)(puVar10 + (int)(local_328[0] + 8)) >> 8) + local_328[0] + 10;
    sVar29 = (size_t)uVar21;
    if (sVar11 < sVar29) break;
LAB_0051a860:
    local_328[0] = uVar21;
    bVar30 = uVar22 == 0;
    uVar22 = uVar22 - 1;
    if (bVar30) {
      uVar22 = *(ushort *)(puVar10 + 10) << 8 | *(ushort *)(puVar10 + 10) >> 8;
      uVar21 = local_328[0];
      goto LAB_0051a8f9;
    }
    DVar7 = skipqname(puVar10,sVar11,local_328);
    if (DVar7 != DOH_OK) goto LAB_0051a961;
    if ((sVar11 < local_328[0] + 8) || (sVar11 < local_328[0] + 10)) break;
  }
  goto LAB_0051a954;
  while( true ) {
    uVar21 = (uint)(ushort)(*(ushort *)(puVar10 + (int)(local_328[0] + 8)) << 8 |
                           *(ushort *)(puVar10 + (int)(local_328[0] + 8)) >> 8) + local_328[0] + 10;
    sVar29 = (size_t)uVar21;
    if (sVar11 < sVar29) break;
LAB_0051a8f9:
    local_328[0] = uVar21;
    bVar30 = uVar22 == 0;
    uVar22 = uVar22 - 1;
    if (bVar30) {
      DVar7 = DOH_DNS_MALFORMAT;
      if (sVar11 == sVar29) {
        DVar7 = DOH_OK;
        if (de.numaddr == 0 && de.numcname == 0) {
          DVar7 = DOH_NO_CONTENT;
        }
        if (uVar26 == 2) {
          DVar7 = DOH_OK;
        }
      }
      goto LAB_0051a961;
    }
    DVar7 = skipqname(puVar10,sVar11,local_328);
    if (DVar7 != DOH_OK) goto LAB_0051a961;
    if ((sVar11 < local_328[0] + 8) || (sVar11 < local_328[0] + 10)) break;
  }
LAB_0051a954:
  DVar7 = DOH_DNS_OUT_OF_RANGE;
LAB_0051a961:
  rc[lVar23] = DVar7;
  Curl_dyn_free(s);
  if (((data != (Curl_easy *)0x0) && (DVar7 != DOH_OK)) && (((data->set).field_0x8bd & 0x10) != 0))
  {
    pcVar19 = "AAAA";
    if (pdVar3->probe[lVar23].dnstype == DNS_TYPE_A) {
      pcVar19 = "A";
    }
    Curl_infof(data,"DoH: %s type %s for %s",(long)&errors_rel + (long)(int)(&errors_rel)[DVar7],
               pcVar19);
  }
LAB_0051a9cd:
  lVar23 = lVar23 + 1;
  goto LAB_0051a4b6;
}

Assistant:

CURLcode Curl_doh_is_resolved(struct Curl_easy *data,
                              struct Curl_dns_entry **dnsp)
{
  CURLcode result;
  struct dohdata *dohp = data->req.doh;
  *dnsp = NULL; /* defaults to no response */
  if(!dohp)
    return CURLE_OUT_OF_MEMORY;

  if(!dohp->probe[DOH_PROBE_SLOT_IPADDR_V4].easy &&
     !dohp->probe[DOH_PROBE_SLOT_IPADDR_V6].easy) {
    failf(data, "Could not DoH-resolve: %s", data->state.async.hostname);
    return CONN_IS_PROXIED(data->conn)?CURLE_COULDNT_RESOLVE_PROXY:
      CURLE_COULDNT_RESOLVE_HOST;
  }
  else if(!dohp->pending) {
    DOHcode rc[DOH_PROBE_SLOTS] = {
      DOH_OK, DOH_OK
    };
    struct dohentry de;
    int slot;
    /* remove DoH handles from multi handle and close them */
    for(slot = 0; slot < DOH_PROBE_SLOTS; slot++) {
      curl_multi_remove_handle(data->multi, dohp->probe[slot].easy);
      Curl_close(&dohp->probe[slot].easy);
    }
    /* parse the responses, create the struct and return it! */
    de_init(&de);
    for(slot = 0; slot < DOH_PROBE_SLOTS; slot++) {
      struct dnsprobe *p = &dohp->probe[slot];
      if(!p->dnstype)
        continue;
      rc[slot] = doh_decode(Curl_dyn_uptr(&p->serverdoh),
                            Curl_dyn_len(&p->serverdoh),
                            p->dnstype,
                            &de);
      Curl_dyn_free(&p->serverdoh);
#ifndef CURL_DISABLE_VERBOSE_STRINGS
      if(rc[slot]) {
        infof(data, "DoH: %s type %s for %s", doh_strerror(rc[slot]),
              type2name(p->dnstype), dohp->host);
      }
#endif
    } /* next slot */

    result = CURLE_COULDNT_RESOLVE_HOST; /* until we know better */
    if(!rc[DOH_PROBE_SLOT_IPADDR_V4] || !rc[DOH_PROBE_SLOT_IPADDR_V6]) {
      /* we have an address, of one kind or other */
      struct Curl_dns_entry *dns;
      struct Curl_addrinfo *ai;

      infof(data, "DoH Host name: %s", dohp->host);
      showdoh(data, &de);

      result = doh2ai(&de, dohp->host, dohp->port, &ai);
      if(result) {
        de_cleanup(&de);
        return result;
      }

      if(data->share)
        Curl_share_lock(data, CURL_LOCK_DATA_DNS, CURL_LOCK_ACCESS_SINGLE);

      /* we got a response, store it in the cache */
      dns = Curl_cache_addr(data, ai, dohp->host, 0, dohp->port);

      if(data->share)
        Curl_share_unlock(data, CURL_LOCK_DATA_DNS);

      if(!dns) {
        /* returned failure, bail out nicely */
        Curl_freeaddrinfo(ai);
      }
      else {
        data->state.async.dns = dns;
        *dnsp = dns;
        result = CURLE_OK;      /* address resolution OK */
      }
    } /* address processing done */

    /* Now process any build-specific attributes retrieved from DNS */

    /* All done */
    de_cleanup(&de);
    Curl_safefree(data->req.doh);
    return result;

  } /* !dohp->pending */

  /* else wait for pending DoH transactions to complete */
  return CURLE_OK;
}